

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void jmp_short(PDISASM pMyDisasm)

{
  int iVar1;
  long MyNumber;
  UInt64 MyAddress;
  PDISASM pMyDisasm_local;
  
  MyNumber = 0;
  (pMyDisasm->Instruction).Category = 0x10006;
  (pMyDisasm->Instruction).BranchType = 0xb;
  (pMyDisasm->Operand1).OpSize = 8;
  MyAddress = (UInt64)pMyDisasm;
  strcpy((pMyDisasm->Instruction).Mnemonic,"jmp");
  iVar1 = Security(2,(PDISASM)MyAddress);
  if (iVar1 != 0) {
    CalculateRelativeAddress
              ((UInt64 *)&MyNumber,
               (long)*(int *)(MyAddress + 0x904) + 2 +
               (long)*(char *)(*(long *)(MyAddress + 0x8a4) + 1),(PDISASM)MyAddress);
    if (*(int *)(MyAddress + 0x8c0) == 0x10) {
      MyNumber = MyNumber & 0xffff;
    }
    if ((ulong)MyNumber < 0x100000000) {
      CopyFormattedNumber((PDISASM)MyAddress,(char *)(MyAddress + 0x1a0),"%.8X",MyNumber);
    }
    else {
      CopyFormattedNumber((PDISASM)MyAddress,(char *)(MyAddress + 0x1a0),"%.16llX",MyNumber);
    }
    *(undefined8 *)(MyAddress + 0x1b8) = 0x4040000;
    *(undefined4 *)(MyAddress + 0x1c8) = 1;
    *(long *)(MyAddress + 0xa0) = MyNumber;
    *(long *)(MyAddress + 0x8a4) = *(long *)(MyAddress + 0x8a4) + 2;
    FillFlags((PDISASM)MyAddress,0x31);
  }
  return;
}

Assistant:

void __bea_callspec__ jmp_short(PDISASM pMyDisasm)
{
    UInt64 MyAddress = 0;
    signed long MyNumber = 0;
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+CONTROL_TRANSFER;
    pMyDisasm->Instruction.BranchType = JmpType;
    pMyDisasm->Operand1.OpSize = 8;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "jmp");
    #endif
    if (!Security(2, pMyDisasm)) return;
    MyNumber = *((Int8*) (GV.EIP_+1));
    CalculateRelativeAddress(&MyAddress,(Int64) GV.NB_PREFIX+2+MyNumber, pMyDisasm);
    if (GV.OperandSize == 16) MyAddress = MyAddress & 0xffff;
    if (MyAddress >= W64LIT (0x100000000)) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand1.OpMnemonic, "%.16llX",(Int64) MyAddress);
        #endif
    }
    else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand1.OpMnemonic, "%.8X",(Int64) MyAddress);
        #endif
    }
    pMyDisasm->Operand1.OpType = CONSTANT_TYPE+RELATIVE_;
    pMyDisasm->Operand1.AccessMode = READ;
    pMyDisasm->Instruction.AddrValue = MyAddress;
    GV.EIP_+=2;
    FillFlags(pMyDisasm,49);
}